

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_141b3c6::QBidiAlgorithm::process(QBidiAlgorithm *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  QVarLengthArray<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun,_64LL> *in_RDI;
  long in_FS_OFFSET;
  int l;
  int i_1;
  int lastBNPos;
  int lastLevel;
  int i;
  bool resetLevel;
  bool hasBidi;
  Vector<DirectionalRun> runs;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  int iVar4;
  undefined4 in_stack_fffffffffffffbc0;
  int iVar5;
  undefined4 in_stack_fffffffffffffbc4;
  uint uVar6;
  int local_438;
  bool local_421;
  QVarLengthArray<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun,_64LL> local_420;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset((void *)(in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                 super_QVLABaseBase.s,0,
         (long)*(int *)&(in_RDI->
                        super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                        super_QVLABaseBase.ptr << 2);
  bVar2 = checkForBidi((QBidiAlgorithm *)
                       CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  if (bVar2) {
    memset(&local_420,0xaa,0x418);
    QVarLengthArray<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun,_64LL>::QVarLengthArray
              (&local_420);
    resolveExplicitLevels
              ((QBidiAlgorithm *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
               (Vector<DirectionalRun> *)
               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    resolveImplicitLevels
              ((QBidiAlgorithm *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
               (Vector<DirectionalRun> *)
               CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    QVarLengthArray<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun,_64LL>::~QVarLengthArray
              (in_RDI);
    bVar2 = true;
    local_438 = *(int *)&(in_RDI->
                         super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                         super_QVLABaseBase.ptr;
    while (local_438 = local_438 + -1, -1 < local_438) {
      if ((*(uint *)((in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>)
                     .super_QVLABaseBase.s + (long)local_438 * 4) >> 0xc & 4) == 0) {
        if ((bVar2) &&
           ((*(uint *)((in_RDI->
                       super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                       super_QVLABaseBase.s + (long)local_438 * 4) >> 0xc & 2) != 0)) {
          lVar1 = (in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                  super_QVLABaseBase.s;
          *(uint *)(lVar1 + (long)local_438 * 4) =
               *(uint *)(lVar1 + (long)local_438 * 4) & 0xff00ffff |
               ((ushort)(short)*(char *)((long)&(in_RDI->
                                                super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>
                                                ).super_QVLABaseBase.ptr + 4) & 0xff) << 0x10;
        }
        else {
          bVar2 = false;
        }
      }
      else {
        lVar1 = (in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                super_QVLABaseBase.s;
        *(uint *)(lVar1 + (long)local_438 * 4) =
             *(uint *)(lVar1 + (long)local_438 * 4) & 0xff00ffff |
             ((ushort)(short)*(char *)((long)&(in_RDI->
                                              super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>
                                              ).super_QVLABaseBase.ptr + 4) & 0xff) << 0x10;
        bVar2 = true;
      }
    }
    iVar5 = -1;
    uVar6 = (int)*(char *)((long)&(in_RDI->
                                  super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>
                                  ).super_QVLABaseBase.ptr + 4);
    for (iVar4 = 0;
        iVar4 < *(int *)&(in_RDI->
                         super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                         super_QVLABaseBase.ptr; iVar4 = iVar4 + 1) {
      if ((*(uint *)((in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>)
                     .super_QVLABaseBase.s + (long)iVar4 * 4) >> 0xc & 1) == 0) {
        uVar3 = *(uint *)((in_RDI->
                          super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                          super_QVLABaseBase.s + (long)iVar4 * 4) >> 0x10 & 0xff;
        if (-1 < iVar5) {
          if ((int)uVar3 < (int)uVar6) {
            for (; iVar5 < iVar4; iVar5 = iVar5 + 1) {
              lVar1 = (in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>
                      ).super_QVLABaseBase.s;
              *(uint *)(lVar1 + (long)iVar5 * 4) =
                   *(uint *)(lVar1 + (long)iVar5 * 4) & 0xff00ffff | uVar3 << 0x10;
            }
          }
          iVar5 = -1;
        }
      }
      else {
        if (iVar5 < 0) {
          iVar5 = iVar4;
        }
        lVar1 = (in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                super_QVLABaseBase.s;
        *(uint *)(lVar1 + (long)iVar4 * 4) =
             *(uint *)(lVar1 + (long)iVar4 * 4) & 0xff00ffff | (uVar6 & 0xff) << 0x10;
        uVar3 = uVar6;
      }
      uVar6 = uVar3;
    }
    if ((-1 < iVar5) &&
       ((int)*(char *)((long)&(in_RDI->
                              super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>)
                              .super_QVLABaseBase.ptr + 4) < (int)uVar6)) {
      for (; iVar5 < *(int *)&(in_RDI->
                              super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>)
                              .super_QVLABaseBase.ptr; iVar5 = iVar5 + 1) {
        lVar1 = (in_RDI->super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>).
                super_QVLABaseBase.s;
        *(uint *)(lVar1 + (long)iVar5 * 4) =
             *(uint *)(lVar1 + (long)iVar5 * 4) & 0xff00ffff |
             ((ushort)(short)*(char *)((long)&(in_RDI->
                                              super_QVLABase<(anonymous_namespace)::QBidiAlgorithm::DirectionalRun>
                                              ).super_QVLABaseBase.ptr + 4) & 0xff) << 0x10;
      }
    }
    local_421 = true;
  }
  else {
    local_421 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_421;
}

Assistant:

bool process()
    {
        memset(analysis, 0, length * sizeof(QScriptAnalysis));

        bool hasBidi = checkForBidi();

        if (!hasBidi)
            return false;

        if (BidiDebugEnabled) {
            BIDI_DEBUG() << ">>>> start bidi, text length" << length;
            for (int i = 0; i < length; ++i)
                BIDI_DEBUG() << Qt::hex << "    (" << i << ")" << text[i].unicode() << text[i].direction();
        }

        {
            Vector<DirectionalRun> runs;
            resolveExplicitLevels(runs);

            if (BidiDebugEnabled) {
                BIDI_DEBUG() << "resolved explicit levels, nruns" << runs.size();
                for (int i = 0; i < runs.size(); ++i)
                    BIDI_DEBUG() << "    " << i << "start/end" << runs.at(i).start << runs.at(i).end << "level" << (int)runs.at(i).level << "continuation" << runs.at(i).continuation;
            }

            // now we have a list of isolated run sequences inside the vector of runs, that can be fed
            // through the implicit level resolving

            resolveImplicitLevels(runs);
        }

        BIDI_DEBUG() << "Rule L1:";
        // Rule L1:
        bool resetLevel = true;
        for (int i = length - 1; i >= 0; --i) {
            if (analysis[i].bidiFlags & QScriptAnalysis::BidiResetToParagraphLevel) {
                BIDI_DEBUG() << "resetting pos" << i << "to baselevel";
                analysis[i].bidiLevel = baseLevel;
                resetLevel = true;
            } else if (resetLevel && analysis[i].bidiFlags & QScriptAnalysis::BidiMaybeResetToParagraphLevel) {
                BIDI_DEBUG() << "resetting pos" << i << "to baselevel (maybereset flag)";
                analysis[i].bidiLevel = baseLevel;
            } else {
                resetLevel = false;
            }
        }

        // set directions for BN to the minimum of adjacent chars
        // This makes is possible to be conformant with the Bidi algorithm even though we don't
        // remove BN and explicit embedding chars from the stream of characters to reorder
        int lastLevel = baseLevel;
        int lastBNPos = -1;
        for (int i = 0; i < length; ++i) {
            if (analysis[i].bidiFlags & QScriptAnalysis::BidiBN) {
                if (lastBNPos < 0)
                    lastBNPos = i;
                analysis[i].bidiLevel = lastLevel;
            } else {
                int l = analysis[i].bidiLevel;
                if (lastBNPos >= 0) {
                    if (l < lastLevel) {
                        while (lastBNPos < i) {
                            analysis[lastBNPos].bidiLevel = l;
                            ++lastBNPos;
                        }
                    }
                    lastBNPos = -1;
                }
                lastLevel = l;
            }
        }
        if (lastBNPos >= 0 && baseLevel < lastLevel) {
            while (lastBNPos < length) {
                analysis[lastBNPos].bidiLevel = baseLevel;
                ++lastBNPos;
            }
        }

        if (BidiDebugEnabled) {
            BIDI_DEBUG() << "final resolved levels:";
            for (int i = 0; i < length; ++i)
                BIDI_DEBUG() << "    " << i << Qt::hex << text[i].unicode() << Qt::dec << (int)analysis[i].bidiLevel;
        }

        return true;
    }